

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cached-powers.cc
# Opt level: O0

void double_conversion::PowersOfTenCache::GetCachedPowerForDecimalExponent
               (int requested_exponent,DiyFp *power,int *found_exponent)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  int *in_RDX;
  uint64_t *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  int index;
  CachedPower cached_power;
  short sStack_20;
  short sStack_1e;
  DiyFp local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = in_EDI + 0x15c;
  if (in_EDI + 0x15c < 0) {
    iVar2 = in_EDI + 0x163;
  }
  lVar3 = (long)(iVar2 >> 3) * 0x10;
  uVar1 = *(undefined8 *)(kCachedPowers + lVar3 + 8);
  sStack_20 = (short)uVar1;
  DiyFp::DiyFp(&local_18,*(uint64_t *)(kCachedPowers + lVar3),(int)sStack_20);
  *(int32_t *)(in_RSI + 1) = local_18.e_;
  *in_RSI = local_18.f_;
  sStack_1e = (short)((ulong)uVar1 >> 0x10);
  *in_RDX = (int)sStack_1e;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void GetCachedPowerForDecimalExponent(int requested_exponent,
                                      DiyFp* power,
                                      int* found_exponent) {
  DOUBLE_CONVERSION_ASSERT(kMinDecimalExponent <= requested_exponent);
  DOUBLE_CONVERSION_ASSERT(requested_exponent < kMaxDecimalExponent + kDecimalExponentDistance);
  int index =
      (requested_exponent + kCachedPowersOffset) / kDecimalExponentDistance;
  CachedPower cached_power = kCachedPowers[index];
  *power = DiyFp(cached_power.significand, cached_power.binary_exponent);
  *found_exponent = cached_power.decimal_exponent;
  DOUBLE_CONVERSION_ASSERT(*found_exponent <= requested_exponent);
  DOUBLE_CONVERSION_ASSERT(requested_exponent < *found_exponent + kDecimalExponentDistance);
}